

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O2

void Imf_3_2::copyIntoFrameBuffer
               (char **readPtr,char *writePtr,char *endPtr,size_t xStride,bool fill,double fillValue
               ,Format format,PixelType typeInFrameBuffer,PixelType typeInFile)

{
  ushort *puVar1;
  half hVar2;
  uint uVar3;
  ulong in_RAX;
  size_t i;
  char *pcVar4;
  ArgExc *this;
  long lVar5;
  undefined3 in_register_00000081;
  size_t __n;
  half fillVal;
  ulong uStack_38;
  
  uStack_38 = in_RAX;
  if (CONCAT31(in_register_00000081,fill) == 0) {
    if (format == XDR) {
      if (typeInFrameBuffer == FLOAT) {
        if (typeInFile == UINT) {
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>(readPtr,(uint *)&fillVal);
            *(float *)writePtr = (float)(uStack_38 >> 0x20);
          }
        }
        else if (typeInFile == HALF) {
          for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>(readPtr,&fillVal);
            *(undefined4 *)writePtr =
                 *(undefined4 *)(_imath_half_to_float_table + (uStack_38 >> 0x20 & 0xffff) * 4);
          }
        }
        else {
          if (typeInFile != FLOAT) {
            this = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(this,"Unknown pixel data type.");
            goto LAB_00192515;
          }
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>(readPtr,(float *)writePtr);
          }
        }
      }
      else if (typeInFrameBuffer == HALF) {
        if (typeInFile == UINT) {
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>(readPtr,(uint *)&fillVal);
            hVar2 = uintToHalf((uint)_fillVal);
            *(uint16_t *)writePtr = hVar2._h;
          }
        }
        else if (typeInFile == HALF) {
          for (; writePtr <= endPtr; writePtr = (char *)((long)&((half *)writePtr)->_h + xStride)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>(readPtr,(half *)writePtr);
          }
        }
        else {
          if (typeInFile != FLOAT) {
            this = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(this,"Unknown pixel data type.");
            goto LAB_00192515;
          }
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>(readPtr,(float *)&fillVal);
            hVar2 = floatToHalf(_fillVal);
            *(uint16_t *)writePtr = hVar2._h;
          }
        }
      }
      else {
        if (typeInFrameBuffer != UINT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"Unknown pixel data type.");
LAB_00192515:
          __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
        if (typeInFile == UINT) {
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>(readPtr,(uint *)writePtr);
          }
        }
        else if (typeInFile == HALF) {
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>(readPtr,&fillVal);
            uVar3 = halfToUint(fillVal);
            *(uint *)writePtr = uVar3;
          }
        }
        else {
          if (typeInFile != FLOAT) {
            this = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(this,"Unknown pixel data type.");
            goto LAB_00192515;
          }
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>(readPtr,(float *)&fillVal);
            uVar3 = floatToUint(_fillVal);
            *(uint *)writePtr = uVar3;
          }
        }
      }
    }
    else if (typeInFrameBuffer == FLOAT) {
      if (typeInFile == UINT) {
        pcVar4 = *readPtr;
        for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            *(char *)((long)&fillVal._h + lVar5) = pcVar4[lVar5];
          }
          *(float *)writePtr = (float)(in_RAX >> 0x20);
          pcVar4 = pcVar4 + 4;
          *readPtr = pcVar4;
        }
      }
      else if (typeInFile == HALF) {
        for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
          puVar1 = (ushort *)*readPtr;
          *(undefined4 *)writePtr = *(undefined4 *)(_imath_half_to_float_table + (ulong)*puVar1 * 4)
          ;
          *readPtr = (char *)(puVar1 + 1);
        }
      }
      else {
        if (typeInFile != FLOAT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"Unknown pixel data type.");
          goto LAB_00192515;
        }
        for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            writePtr[lVar5] = (*readPtr)[lVar5];
          }
          *readPtr = *readPtr + 4;
        }
      }
    }
    else if (typeInFrameBuffer == HALF) {
      if (typeInFile == UINT) {
        for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
          pcVar4 = *readPtr;
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            *(char *)((long)&fillVal._h + lVar5) = pcVar4[lVar5];
          }
          hVar2 = uintToHalf((uint)_fillVal);
          *(uint16_t *)writePtr = hVar2._h;
          *readPtr = *readPtr + 4;
        }
      }
      else if (typeInFile == HALF) {
        if (xStride == 2) {
          __n = (size_t)(((int)endPtr - (int)writePtr) + 2);
          memcpy(writePtr,*readPtr,__n);
          *readPtr = *readPtr + __n;
        }
        else {
          pcVar4 = *readPtr;
          for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
            *(undefined2 *)writePtr = *(undefined2 *)pcVar4;
            *readPtr = pcVar4 + 2;
            pcVar4 = pcVar4 + 2;
          }
        }
      }
      else {
        if (typeInFile != FLOAT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"Unknown pixel data type.");
          goto LAB_00192515;
        }
        for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
          pcVar4 = *readPtr;
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            *(char *)((long)&fillVal._h + lVar5) = pcVar4[lVar5];
          }
          hVar2 = floatToHalf(_fillVal);
          *(uint16_t *)writePtr = hVar2._h;
          *readPtr = *readPtr + 4;
        }
      }
    }
    else {
      if (typeInFrameBuffer != UINT) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this,"Unknown pixel data type.");
        goto LAB_00192515;
      }
      if (typeInFile == UINT) {
        for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            writePtr[lVar5] = (*readPtr)[lVar5];
          }
          *readPtr = *readPtr + 4;
        }
      }
      else if (typeInFile == HALF) {
        for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
          uVar3 = halfToUint((half)*(uint16_t *)*readPtr);
          *(uint *)writePtr = uVar3;
          *readPtr = *readPtr + 2;
        }
      }
      else {
        if (typeInFile != FLOAT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"Unknown pixel data type.");
          goto LAB_00192515;
        }
        for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
          pcVar4 = *readPtr;
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            *(char *)((long)&fillVal._h + lVar5) = pcVar4[lVar5];
          }
          uVar3 = floatToUint(_fillVal);
          *(uint *)writePtr = uVar3;
          *readPtr = *readPtr + 4;
        }
      }
    }
  }
  else if (typeInFrameBuffer == FLOAT) {
    for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
      *(float *)writePtr = (float)fillValue;
    }
  }
  else if (typeInFrameBuffer == HALF) {
    Imath_3_2::half::half(&fillVal,(float)fillValue);
    for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
      *(uint16_t *)writePtr = fillVal._h;
    }
  }
  else {
    if (typeInFrameBuffer != UINT) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(this,"Unknown pixel data type.");
      goto LAB_00192515;
    }
    for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
      *(int *)writePtr = (int)(long)fillValue;
    }
  }
  return;
}

Assistant:

void
copyIntoFrameBuffer (
    const char*&       readPtr,
    char*              writePtr,
    char*              endPtr,
    size_t             xStride,
    bool               fill,
    double             fillValue,
    Compressor::Format format,
    PixelType          typeInFrameBuffer,
    PixelType          typeInFile)
{
    //
    // Copy a horizontal row of pixels from an input
    // file's line or tile buffer to a frame buffer.
    //

    if (fill)
    {
        //
        // The file contains no data for this channel.
        // Store a default value in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            {
                unsigned int fillVal = (unsigned int) (fillValue);

                while (writePtr <= endPtr)
                {
                    *(unsigned int*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            {
                half fillVal = half (fillValue);

                while (writePtr <= endPtr)
                {
                    *(half*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            {
                float fillVal = float (fillValue);

                while (writePtr <= endPtr)
                {
                    *(float*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else if (format == Compressor::XDR)
    {
        //
        // The the line or tile buffer is in XDR format.
        //
        // Convert the pixels from the file's machine-
        // independent representation, and store the
        // results in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (
                                readPtr, *(unsigned int*) writePtr);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h;
                            Xdr::read<CharPtrIO> (readPtr, h);
                            *(unsigned int*) writePtr = halfToUint (h);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;
                            Xdr::read<CharPtrIO> (readPtr, f);
                            *(unsigned int*) writePtr = floatToUint (f);
                            writePtr += xStride;
                        }
                        break;

                    default:
                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;
                            Xdr::read<CharPtrIO> (readPtr, ui);
                            *(half*) writePtr = uintToHalf (ui);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (readPtr, *(half*) writePtr);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;
                            Xdr::read<CharPtrIO> (readPtr, f);
                            *(half*) writePtr = floatToHalf (f);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;
                            Xdr::read<CharPtrIO> (readPtr, ui);
                            *(float*) writePtr = float (ui);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h;
                            Xdr::read<CharPtrIO> (readPtr, h);
                            *(float*) writePtr = float (h);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (readPtr, *(float*) writePtr);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The the line or tile buffer is in NATIVE format.
        // Copy the results into the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                writePtr[i] = readPtr[i];

                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h                    = *(half*) readPtr;
                            *(unsigned int*) writePtr = halfToUint (h);
                            readPtr += sizeof (half);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;

                            for (size_t i = 0; i < sizeof (float); ++i)
                                ((char*) &f)[i] = readPtr[i];

                            *(unsigned int*) writePtr = floatToUint (f);
                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;

                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;

                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                ((char*) &ui)[i] = readPtr[i];

                            *(half*) writePtr = uintToHalf (ui);
                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        // If we're tightly packed, just memcpy
                        if (xStride == sizeof (half))
                        {
                            int numBytes = endPtr - writePtr + sizeof (half);
                            memcpy (writePtr, readPtr, numBytes);
                            readPtr += numBytes;
                            writePtr += numBytes;
                        }
                        else
                        {
                            while (writePtr <= endPtr)
                            {
                                *(half*) writePtr = *(half*) readPtr;
                                readPtr += sizeof (half);
                                writePtr += xStride;
                            }
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;

                            for (size_t i = 0; i < sizeof (float); ++i)
                                ((char*) &f)[i] = readPtr[i];

                            *(half*) writePtr = floatToHalf (f);
                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;

                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                ((char*) &ui)[i] = readPtr[i];

                            *(float*) writePtr = float (ui);
                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h             = *(half*) readPtr;
                            *(float*) writePtr = float (h);
                            readPtr += sizeof (half);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            for (size_t i = 0; i < sizeof (float); ++i)
                                writePtr[i] = readPtr[i];

                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
}